

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_ASCII85Decoder.cc
# Opt level: O2

void __thiscall Pl_ASCII85Decoder::flush(Pl_ASCII85Decoder *this)

{
  size_t sVar1;
  Pipeline *pPVar2;
  ulong uVar3;
  int i;
  uint uVar4;
  long lVar5;
  ulong uStack_8;
  uchar outbuf [4];
  
  sVar1 = this->pos;
  if (sVar1 != 0) {
    uVar3 = 0;
    for (lVar5 = -5; lVar5 != 0; lVar5 = lVar5 + 1) {
      uVar3 = (ulong)(this->inbuf[lVar5 + 5] - 0x21) + uVar3 * 0x55;
    }
    uStack_8 = (ulong)this->inbuf & 0xffffffff;
    for (uVar4 = 3; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
      outbuf[uVar4] = (uchar)uVar3;
      uVar3 = uVar3 >> 8;
    }
    this->pos = 0;
    builtin_memcpy(this->inbuf,"uuuuu",5);
    pPVar2 = (this->super_Pipeline).next_;
    (*pPVar2->_vptr_Pipeline[2])(pPVar2,outbuf,sVar1 - 1);
  }
  return;
}

Assistant:

void
Pl_ASCII85Decoder::flush()
{
    if (this->pos == 0) {
        QTC::TC("libtests", "Pl_ASCII85Decoder no-op flush");
        return;
    }
    unsigned long lval = 0;
    for (int i = 0; i < 5; ++i) {
        lval *= 85;
        lval += (this->inbuf[i] - 33U);
    }

    unsigned char outbuf[4];
    memset(outbuf, 0, 4);
    for (int i = 3; i >= 0; --i) {
        outbuf[i] = lval & 0xff;
        lval >>= 8;
    }

    QTC::TC("libtests", "Pl_ASCII85Decoder partial flush", (this->pos == 5) ? 0 : 1);
    // Reset before calling getNext()->write in case that throws an exception.
    auto t = this->pos - 1;
    this->pos = 0;
    memset(this->inbuf, 117, 5);

    next()->write(outbuf, t);
}